

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O1

Expr * __thiscall SQCompilation::SQParser::ShiftExp(SQParser *this)

{
  uint32_t uVar1;
  long lVar2;
  Expr *pEVar3;
  Expr *lhs;
  int iVar4;
  
  if (500 < this->_depth) {
    reportDiagnostic(this,0x1d);
  }
  this->_depth = this->_depth + 1;
  pEVar3 = PlusExp(this);
  iVar4 = 1;
  do {
    if (500 < this->_depth) {
      reportDiagnostic(this,0x1d);
    }
    uVar1 = this->_depth;
    this->_depth = uVar1 + 1;
    lVar2 = this->_token;
    if (lVar2 == 0x128) {
      lhs = (Expr *)0x25;
    }
    else if (lVar2 == 0x129) {
      lhs = (Expr *)0x24;
    }
    else {
      lhs = (Expr *)0x23;
      if (lVar2 != 0x132) {
        this->_depth = uVar1 - iVar4;
        return pEVar3;
      }
    }
    iVar4 = iVar4 + 1;
    pEVar3 = BIN_EXP<SQCompilation::Expr*(SQCompilation::SQParser::*)()>(this,0x163d56,TO_BLOCK,lhs)
    ;
  } while( true );
}

Assistant:

Expr* SQParser::ShiftExp()
{
    NestingChecker nc(this);
    Expr *lhs = PlusExp();
    for (;;) {
        nc.inc();
        switch (_token) {
        case TK_USHIFTR: lhs = BIN_EXP(&SQParser::PlusExp, TO_USHR, lhs); break;
        case TK_SHIFTL: lhs = BIN_EXP(&SQParser::PlusExp, TO_SHL, lhs); break;
        case TK_SHIFTR: lhs = BIN_EXP(&SQParser::PlusExp, TO_SHR, lhs); break;
        default: return lhs;
        }
    }
}